

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  bool bVar1;
  ImGuiID cond;
  undefined4 in_EDX;
  byte *in_RSI;
  ImVec2 IVar2;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000334;
  bool *in_stack_00000338;
  char *in_stack_00000340;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar3;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  ImGuiID in_stack_ffffffffffffffc4;
  float fVar4;
  ImGuiWindow *pos;
  ImGuiContext *pIVar5;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  pos = GImGui->CurrentWindow;
  pIVar5 = GImGui;
  cond = ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                            &GImGui->Initialized,(char *)pos);
  bVar1 = IsPopupOpen(in_stack_ffffffffffffffc4);
  if (bVar1) {
    if (((pIVar5->NextWindowData).Flags & 1U) == 0) {
      IVar2 = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          0.0);
      fVar4 = IVar2.x;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,0.5,0.5);
      SetNextWindowPos((ImVec2 *)pos,cond,(ImVec2 *)CONCAT44(fVar4,in_stack_ffffffffffffffc0));
    }
    local_1 = Begin(in_stack_00000340,in_stack_00000338,in_stack_00000334);
    uVar3 = (uint)local_1 << 0x18;
    if ((!local_1) || ((in_RSI != (byte *)0x0 && ((*in_RSI & 1) == 0)))) {
      EndPopup();
      if ((uVar3 & 0x1000000) != 0) {
        ClosePopupToLevel((int)((ulong)pos >> 0x20),SUB81((ulong)pos >> 0x18,0));
      }
      local_1 = false;
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags(&pIVar5->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}